

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O3

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  int iVar3;
  mz_bool mVar4;
  size_t sVar5;
  size_t sVar6;
  undefined2 uVar7;
  undefined4 uVar8;
  mz_uint64 mVar9;
  mz_uint8 hdr [22];
  undefined8 local_38;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 uStack_28;
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  undefined2 uStack_24;
  
  mVar2 = 0;
  mVar4 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    pmVar1 = pZip->m_pState;
    mVar4 = 0;
    if (((pmVar1 != (mz_zip_internal_state *)0x0) &&
        (mVar4 = mVar2, pZip->m_zip_mode == MZ_ZIP_MODE_WRITING)) && (pZip->m_total_files < 0x10000)
       ) {
      mVar9 = pZip->m_archive_size;
      sVar6 = (pmVar1->m_central_dir).m_size;
      if (0xfffffffeffffffff < (mVar9 + sVar6) - 0xffffffea) {
        if (pZip->m_total_files == 0) {
          uVar7 = 0;
          uVar8 = 0;
          sVar6 = 0;
        }
        else {
          pZip->m_central_directory_file_ofs = mVar9;
          sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar9,(pmVar1->m_central_dir).m_p,sVar6);
          if (sVar5 != sVar6) {
            return 0;
          }
          uVar8 = (undefined4)mVar9;
          mVar9 = pZip->m_archive_size + sVar6;
          pZip->m_archive_size = mVar9;
          uVar7 = (undefined2)pZip->m_total_files;
        }
        uStack_24 = 0;
        local_38 = 0x6054b50;
        uStack_30 = (undefined1)uVar7;
        uStack_2f = (undefined1)((ushort)uVar7 >> 8);
        uStack_2c = (undefined1)sVar6;
        uStack_2b = (undefined1)(sVar6 >> 8);
        uStack_2a = (undefined1)(sVar6 >> 0x10);
        uStack_29 = (undefined1)(sVar6 >> 0x18);
        uStack_28 = (undefined1)uVar8;
        uStack_27 = (undefined1)((uint)uVar8 >> 8);
        uStack_26 = (undefined1)((uint)uVar8 >> 0x10);
        uStack_25 = (undefined1)((uint)uVar8 >> 0x18);
        uStack_2e = uStack_30;
        uStack_2d = uStack_2f;
        sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar9,&local_38,0x16);
        if (sVar6 == 0x16) {
          if (((FILE *)pmVar1->m_pFile != (FILE *)0x0) &&
             (iVar3 = fflush((FILE *)pmVar1->m_pFile), iVar3 == -1)) {
            return 0;
          }
          pZip->m_archive_size = pZip->m_archive_size + 0x16;
          pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
          mVar4 = 1;
        }
        else {
          mVar4 = 0;
        }
      }
    }
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive* pZip) {
  mz_zip_internal_state* pState;
  mz_uint64 central_dir_ofs, central_dir_size;
  mz_uint8 hdr[MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE];

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;

  pState = pZip->m_pState;

  // no zip64 support yet
  if ((pZip->m_total_files > 0xFFFF) || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) > 0xFFFFFFFF))
    return MZ_FALSE;

  central_dir_ofs = 0;
  central_dir_size = 0;
  if (pZip->m_total_files) {
    // Write central directory
    central_dir_ofs = pZip->m_archive_size;
    central_dir_size = pState->m_central_dir.m_size;
    pZip->m_central_directory_file_ofs = central_dir_ofs;
    if (pZip->m_pWrite(pZip->m_pIO_opaque, central_dir_ofs, pState->m_central_dir.m_p, (size_t)central_dir_size) != central_dir_size)
      return MZ_FALSE;
    pZip->m_archive_size += central_dir_size;
  }

  // Write end of central directory record
  MZ_CLEAR_OBJ(hdr);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, central_dir_size);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, central_dir_ofs);

  if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, sizeof(hdr)) != sizeof(hdr))
    return MZ_FALSE;
#ifndef MINIZ_NO_STDIO
  if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
    return MZ_FALSE;
#endif  // #ifndef MINIZ_NO_STDIO

  pZip->m_archive_size += sizeof(hdr);

  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
  return MZ_TRUE;
}